

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Elt_pointer pbVar1;
  bool bVar2;
  int iVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  optional<std::pair<int,_int>_> location;
  allocator<char> local_7ce;
  allocator<char> local_7cd;
  int aliasIndex;
  Command *local_7c8;
  _Map_pointer local_7c0;
  __string_type args;
  string argFile;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string local_720;
  _Any_data local_700;
  code *local_6f0;
  code *local_6e8;
  string currentFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  string cmdString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  string local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  Command local_620;
  ofstream qfOS;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  stringstream joinedArgs;
  basic_ostream<char,_std::char_traits<char>_> local_1a8 [376];
  
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  arguments.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::_M_range_initialize<char**>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arguments,argv + 1
             ,argv + argc);
  if (arguments.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      arguments.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argFile,"/tmp/tag_aliases",(allocator<char> *)&arg);
    bVar2 = std::operator==(arguments.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur,"--alias-file");
    if (bVar2) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&arguments);
      popFirst(&arg,&arguments);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&argFile,&arg);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&arg);
    }
    popFirst(&cmdString,&arguments);
    arg._M_dataplus._M_p = (pointer)&cmdString;
    for (lVar8 = 0;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                          ((_Iter_pred<main::__0> *)&arg,
                           (Command *)((long)&COMMANDS._M_elems[0].cmd_id_._M_dataplus._M_p + lVar8)
                          ), lVar8 != 0x1a0; lVar8 = lVar8 + 0x1a0) {
      if (bVar2) goto LAB_00105a00;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                        ((_Iter_pred<main::__0> *)&arg,
                         (Command *)((long)&COMMANDS._M_elems[1].cmd_id_._M_dataplus._M_p + lVar8));
      if (bVar2) {
        lVar8 = lVar8 + 0x68;
        goto LAB_00105a00;
      }
      bVar2 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                        ((_Iter_pred<main::__0> *)&arg,
                         (Command *)((long)&COMMANDS._M_elems[2].cmd_id_._M_dataplus._M_p + lVar8));
      if (bVar2) {
        lVar8 = lVar8 + 0xd0;
        goto LAB_00105a00;
      }
      bVar2 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                        ((_Iter_pred<main::__0> *)&arg,
                         (Command *)((long)&COMMANDS._M_elems[3].cmd_id_._M_dataplus._M_p + lVar8));
      if (bVar2) {
        if (lVar8 == 0x1a0) goto LAB_00105d42;
        lVar8 = lVar8 + 0x138;
        goto LAB_00105a00;
      }
    }
    lVar8 = 0x1a0;
    if (!bVar2) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                        ((_Iter_pred<main::__0> *)&arg,COMMANDS._M_elems + 5);
      lVar8 = 0x208;
      if (!bVar2) {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                          ((_Iter_pred<main::__0> *)&arg,COMMANDS._M_elems + 6);
        lVar8 = 0x270;
        if (!bVar2) goto LAB_00105d42;
      }
    }
LAB_00105a00:
    local_7c8 = (Command *)((long)&COMMANDS._M_elems[0].cmd_id_._M_dataplus._M_p + lVar8);
    std::__cxx11::stringstream::stringstream((stringstream *)&joinedArgs);
    pbVar1 = arguments.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_7c0 = arguments.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    __str = arguments.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar7 = arguments.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    while (__str != pbVar1) {
      std::__cxx11::string::string((string *)&arg,__str);
      _qfOS = &arg;
      pbVar4 = std::__detail::operator<<
                         (local_1a8,
                          (_Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                           *)&qfOS);
      std::operator<<((ostream *)pbVar4," ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&arg);
      __str = __str + 1;
      if (__str == pbVar7) {
        __str = local_7c0[1];
        local_7c0 = local_7c0 + 1;
        pbVar7 = __str + 0x10;
      }
    }
    std::__cxx11::stringbuf::str();
    iVar3 = fileno(_stdout);
    iVar3 = isatty(iVar3);
    if ((iVar3 == 0) && (pcVar5 = getenv("SKIP_PIPE_FILTERING"), pcVar5 == (char *)0x0)) {
      iVar3 = Command::runWithoutDefaultArgs(local_7c8,&args);
    }
    else {
      Command::Command(&local_620,local_7c8);
      std::__cxx11::string::string((string *)&local_6c0,&argFile);
      std::__cxx11::string::string((string *)&local_720,&args);
      currentFile._M_dataplus._M_p = (pointer)&currentFile.field_2;
      currentFile._M_string_length = 0;
      currentFile.field_2._M_local_buf[0] = '\0';
      aliasIndex = 1;
      std::ofstream::ofstream(&arg,(string *)&local_6c0,_S_out);
      std::ofstream::ofstream(&qfOS,(string *)&QF_FILE_abi_cxx11_,_S_out);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"all",&local_7cd);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"-q ",&local_7ce);
      location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
      super__Optional_payload_base<std::pair<int,_int>_>._8_4_ = 0;
      location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
      super__Optional_payload_base<std::pair<int,_int>_>._M_payload =
           (_Storage<std::pair<int,_int>,_true>)extraout_RDX;
      vimEditCommand(&local_660,&QF_FILE_abi_cxx11_,location,&local_680);
      aliasForCommand((string *)&local_700,&local_640,&local_660);
      poVar6 = std::operator<<((ostream *)&arg,(string *)local_700._M_pod_data);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_700);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&local_660);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&local_680);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&local_640);
      local_700._8_8_ = 0;
      local_700._M_unused._M_object = operator_new(0x28);
      *(string **)local_700._M_unused._0_8_ = &currentFile;
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
       ((long)local_700._M_unused._0_8_ + 8) = &arg;
      *(int **)((long)local_700._M_unused._0_8_ + 0x10) = &aliasIndex;
      *(ofstream **)((long)local_700._M_unused._0_8_ + 0x18) = &qfOS;
      *(Command **)((long)local_700._M_unused._0_8_ + 0x20) = &local_620;
      local_6e8 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/keith[P]tag/tag.cpp:173:24)>
                  ::_M_invoke;
      local_6f0 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/keith[P]tag/tag.cpp:173:24)>
                  ::_M_manager;
      iVar3 = Command::run(&local_620,&local_720,
                           (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_700);
      if (local_6f0 != (code *)0x0) {
        (*local_6f0)(&local_700,&local_700,3);
      }
      std::ofstream::~ofstream(&qfOS);
      std::ofstream::~ofstream(&arg);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&currentFile);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&local_720);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&local_6c0);
      Command::~Command(&local_620);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&args);
    std::__cxx11::stringstream::~stringstream((stringstream *)&joinedArgs);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&cmdString);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&argFile);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque(&arguments);
    return iVar3;
  }
LAB_00105d42:
  helpAndExit();
}

Assistant:

int main(int argc, char *argv[]) {
  std::deque<std::string> arguments(argv + 1, argv + argc);
  if (arguments.empty())
    helpAndExit();

  std::string argFile("/tmp/tag_aliases");
  if (arguments.front() == "--alias-file") {
    arguments.pop_front();
    argFile = popFirst(arguments);
  }

  let cmdString = popFirst(arguments);
  let *command =
      std::find_if(COMMANDS.begin(), COMMANDS.end(), [&cmdString](auto &cmd) {
        return cmdString == cmd.cmd_id();
      });

  if (command == COMMANDS.end())
    helpAndExit();

  std::stringstream joinedArgs;
  for (auto arg : arguments) {
    joinedArgs << std::quoted(arg) << " ";
  }

  let args = joinedArgs.str();
  let isPiped = !isatty(fileno(stdout));
  if (isPiped && std::getenv("SKIP_PIPE_FILTERING") == nullptr)
    return command->runWithoutDefaultArgs(args);

  return runAndWriteFile(*command, argFile, args);
}